

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagfib2xor.hpp
# Opt level: O3

basic_ostream<char,_std::char_traits<char>_> *
trng::operator<<(basic_ostream<char,_std::char_traits<char>_> *out,
                lagfib2xor<unsigned_long,_168U,_521U> *R)

{
  undefined4 uVar1;
  ostream *poVar2;
  char *__s;
  size_t sVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  char local_2b [3];
  
  uVar1 = *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18);
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = 0x26;
  local_2b[0] = '[';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,local_2b,1);
  __s = lagfib2xor<unsigned_long,_168U,_521U>::name();
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  }
  else {
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar3);
  }
  local_2b[1] = 0x20;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_2b + 1,1);
  pbVar4 = operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar2,&R->S);
  local_2b[2] = 0x5d;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pbVar4,local_2b + 2,1);
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = uVar1;
  return out;
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(
        std::basic_ostream<char_t, traits_t> &out, const lagfib2xor &R) {
      std::ios_base::fmtflags flags(out.flags());
      out.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      out << '[' << lagfib2xor::name() << ' ' << R.S << ']';
      out.flags(flags);
      return out;
    }